

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

string * PrintHRule_abi_cxx11_(string *__return_storage_ptr__,size_t additionalColumns)

{
  ulong uVar1;
  ostream *poVar2;
  ulong local_248;
  size_t i;
  undefined1 local_220 [8];
  string firstColumn;
  undefined1 local_1f8 [8];
  string groupColumn;
  allocator local_1c1;
  undefined1 local_1c0 [8];
  string column;
  stringstream ss;
  ostream local_190 [376];
  size_t local_18;
  size_t additionalColumns_local;
  
  local_18 = additionalColumns;
  additionalColumns_local = (size_t)__return_storage_ptr__;
  celero::console::SetConsoleColor(Default);
  std::__cxx11::stringstream::stringstream((stringstream *)(column.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_1c0,":",&local_1c1);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_1f8,":",(allocator *)(firstColumn.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(firstColumn.field_2._M_local_buf + 0xf));
  while (uVar1 = std::__cxx11::string::length(), uVar1 < 0xf) {
    std::__cxx11::string::operator+=((string *)local_1c0,"-");
  }
  while (uVar1 = std::__cxx11::string::length(), uVar1 < GlobalGroupNameColumnWidth) {
    std::__cxx11::string::operator+=((string *)local_1f8,"-");
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0,":|"
                );
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,":|"
                );
  std::__cxx11::string::operator=((string *)local_1f8,(string *)&i);
  std::__cxx11::string::~string((string *)&i);
  std::__cxx11::string::operator+=((string *)local_1c0,"-:|");
  poVar2 = std::operator<<(local_190,"|");
  std::operator<<(poVar2,(string *)local_1f8);
  for (local_248 = 0; local_248 < local_18 + 8; local_248 = local_248 + 1) {
    std::operator<<(local_190,(string *)local_1c0);
  }
  std::ostream::operator<<(local_190,std::endl<char,std::char_traits<char>>);
  std::__cxx11::stringstream::str();
  std::__cxx11::string::~string((string *)local_220);
  std::__cxx11::string::~string((string *)local_1f8);
  std::__cxx11::string::~string((string *)local_1c0);
  std::__cxx11::stringstream::~stringstream((stringstream *)(column.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string PrintHRule(const size_t additionalColumns = 0)
{
	celero::console::SetConsoleColor(celero::console::ConsoleColor::Default);

	std::stringstream ss;
	std::string column{":"};
	std::string groupColumn{":"};

	while(column.length() < PrintConstants::ColumnWidth)
	{
		column += "-";
	}

	while(groupColumn.length() < GlobalGroupNameColumnWidth)
	{
		groupColumn += "-";
	}

	std::string firstColumn = column + ":|";
	groupColumn = groupColumn + ":|";

	column += "-:|";

	ss << "|" << groupColumn;

	for(size_t i = 0; i < PrintConstants::NumberOfColumns + additionalColumns - 1; ++i)
	{
		ss << column;
	}

	ss << std::endl;

	return ss.str();
}